

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

mmkuser_malloc_mock_returntype mmkuser_malloc_mock_stub(size_t param0)

{
  mmk_matcher_kind mVar1;
  mmk_params *pmVar2;
  mmk_matcher *pmVar3;
  ulong uVar4;
  void *pvVar5;
  mmk_va_info *pmVar6;
  int iVar7;
  mmk_matcher *pmVar8;
  mmk_stub_conflict stub;
  mmk_mock_ctx *mock;
  void *data;
  mmk_result *pmVar9;
  mmk_params *pmVar10;
  int *piVar11;
  mmkuser_malloc_mock_returntype pvVar12;
  long *prev;
  _func_void *p_Var13;
  size_t t;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  size_t local_40;
  
  pmVar8 = mmk_matcher_ctx();
  if (pmVar8 == (mmk_matcher *)0x0) {
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    local_40 = param0;
    mmk_verify_register_call(&local_58,0x20);
    for (pmVar10 = mmk_mock_get_params(); pmVar10 != (mmk_params *)0x0; pmVar10 = pmVar10->next) {
      pmVar8 = pmVar10->matcher_ctx->next;
      if (pmVar8 == (mmk_matcher *)0x0) {
        if (pmVar10[4].next == (mmk_params *)param0) goto LAB_00102570;
      }
      else {
        mVar1 = pmVar8->kind;
        if (mVar1 == MMK_MATCHER_ANY) goto LAB_00102570;
        if ((mVar1 >> 0x1e & 1) == 0) {
          if (mVar1 != MMK_MATCHER_THAT) {
LAB_00102570:
            iVar7 = *(int *)((long)&pmVar10[1].matcher_ctx + 4);
            if (iVar7 != 0) {
              piVar11 = __errno_location();
              *piVar11 = iVar7;
            }
            pmVar2 = pmVar10[1].next;
            if (pmVar10[2].matcher_ctx == (mmk_matcher *)0x0) {
              if (pmVar2 == (mmk_params *)0x0) {
                return (mmkuser_malloc_mock_returntype)0x0;
              }
              return pmVar2->matcher_ctx;
            }
            pvVar12 = (mmkuser_malloc_mock_returntype)(*(code *)pmVar10[2].matcher_ctx)(param0);
            if (pmVar2 == (mmk_params *)0x0) {
              return pvVar12;
            }
            return (pmVar10[1].next)->matcher_ctx;
          }
          p_Var13 = mmk_matcher_get_predicate(pmVar8);
          iVar7 = (*p_Var13)(param0);
          if (iVar7 != 0) goto LAB_00102570;
        }
        else {
          pmVar2 = pmVar10[4].next;
          if (((((mVar1 & 2) != MMK_MATCHER_ANY) || (pmVar2 != (mmk_params *)param0)) &&
              (((mVar1 & 4) != MMK_MATCHER_ANY || (pmVar2 <= param0)))) &&
             (((mVar1 & 8) != MMK_MATCHER_ANY || (param0 <= pmVar2)))) goto LAB_00102570;
        }
      }
    }
  }
  else {
    stub = mmk_ctx();
    mock = (mmk_mock_ctx *)mmk_stub_context(stub);
    mmk_mock_report_call();
    if (pmVar8->kind == MMK_MATCHER_THAT) {
      prev = (long *)mmk_mock_params_begin(mock);
      t = 0;
      for (; prev != (long *)0x0; prev = (long *)mmk_mock_params_next(mock,prev)) {
        pmVar3 = pmVar8->next;
        if (pmVar3 == (mmk_matcher *)0x0) {
          if (prev[3] != param0) goto LAB_001025f4;
LAB_001025f0:
          t = t + *prev;
        }
        else {
          mVar1 = pmVar3->kind;
          if (mVar1 == MMK_MATCHER_ANY) goto LAB_001025f0;
          if ((mVar1 >> 0x1e & 1) == 0) {
            if (mVar1 == MMK_MATCHER_THAT) {
              p_Var13 = mmk_matcher_get_predicate(pmVar3);
              iVar7 = (*p_Var13)(prev[3]);
              if (iVar7 == 0) goto LAB_001025f4;
            }
            goto LAB_001025f0;
          }
          uVar4 = prev[3];
          if (((((mVar1 & 2) != MMK_MATCHER_ANY) || (uVar4 != param0)) &&
              (((mVar1 & 4) != MMK_MATCHER_ANY || (param0 <= uVar4)))) &&
             (((mVar1 & 8) != MMK_MATCHER_ANY || (uVar4 <= param0)))) goto LAB_001025f0;
        }
LAB_001025f4:
      }
      while (pmVar8 != (mmk_matcher *)0x0) {
        pmVar3 = pmVar8->next;
        mmk_free(pmVar8);
        pmVar8 = pmVar3;
      }
      mmk_verify_set_times(t);
    }
    else if (pmVar8->kind == MMK_MATCHER_ANY) {
      data = mmk_malloc(0x50);
      pmVar9 = mmk_when_get_result();
      pvVar5 = pmVar9->then_return;
      p_Var13 = pmVar9->then_call;
      pmVar6 = pmVar9->with_va;
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)pmVar9;
      *(void **)((long)data + 0x18) = pvVar5;
      *(_func_void **)((long)data + 0x20) = p_Var13;
      *(mmk_va_info **)((long)data + 0x28) = pmVar6;
      *(size_t *)((long)data + 0x48) = param0;
      mmk_when_impl(mock,data);
    }
  }
  return (mmkuser_malloc_mock_returntype)0x0;
}

Assistant:

void test_simple_case(void)
{
    static char ref[] = "hello";
    char buf[sizeof (ref)];

    malloc_mock m = mmk_mock("malloc@lib:strdup", malloc_mock);
    mmk_assert((mmk_fn) m != MMK_MOCK_INVALID);

    mmk_when(malloc(sizeof(ref)), .then_return = &(char*) { buf });

    char *dup = my_strdup("hello");

    /* mmk_verify is overkill in this case, mmk_verify should be used when you
     * care about testing interactions rather than external behaviour */
    int pass = mmk_verify(malloc(mmk_ge(size_t, sizeof (ref))), .times = 1);

    mmk_assert(pass);
    mmk_assert(dup == buf && !strcmp(ref, buf));

    mmk_reset(malloc);
}